

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O2

void __thiscall
Compiler::writeTypeCheckingErrors
          (Compiler *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *errors)

{
  pointer pbVar1;
  ostream *poVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *error;
  pointer pbVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_280;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  string fileName;
  ofstream stream;
  
  if ((errors->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start !=
      (errors->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    extractFileName_abi_cxx11_(&fileName,this);
    std::operator+(&local_280,"Output/",&fileName);
    std::operator+(&local_260,&local_280,"_typecheck_errors.txt");
    std::ofstream::ofstream(&stream,(string *)&local_260,_S_out);
    std::__cxx11::string::~string((string *)&local_260);
    std::__cxx11::string::~string((string *)&local_280);
    std::operator<<((ostream *)&stream,
                    "============================ TYPE CHECKING ERRORS ========================= \n"
                   );
    pbVar1 = (errors->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    for (pbVar3 = (errors->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start; pbVar3 != pbVar1; pbVar3 = pbVar3 + 1)
    {
      poVar2 = std::operator<<((ostream *)&stream,(string *)pbVar3);
      std::operator<<(poVar2,"\n");
    }
    std::ofstream::close();
    std::ofstream::~ofstream(&stream);
    std::__cxx11::string::~string((string *)&fileName);
  }
  return;
}

Assistant:

void Compiler::writeTypeCheckingErrors(const std::vector<std::string> &errors) {
    if (errors.empty()) return;
    std::string fileName = extractFileName();
    std::ofstream stream("Output/" + fileName + "_typecheck_errors.txt");
    stream << "============================ TYPE CHECKING ERRORS ========================= \n";
    for (const auto & error : errors) stream << error << "\n";
    stream.close();
}